

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceCacheVk.cpp
# Opt level: O0

void __thiscall
Diligent::ShaderResourceCacheVk::InitializeSets
          (ShaderResourceCacheVk *this,IMemoryAllocator *MemAllocator,Uint32 NumSets,
          Uint32 *SetSizes)

{
  bool bVar1;
  int iVar2;
  Char *pCVar3;
  char (*pacVar4) [55];
  char (*Args_1) [55];
  undefined4 extraout_var;
  pointer pvVar5;
  DescriptorSet *this_00;
  reference this_01;
  char (*in_R8) [37];
  Resource *local_168;
  undefined1 local_118 [8];
  string msg_4;
  Resource *pRStack_f0;
  Uint32 t_1;
  Resource *pCurrResPtr;
  DescriptorSet *pSets;
  unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_> local_d8;
  undefined1 local_c8 [8];
  string msg_3;
  size_t MemorySize;
  string msg_2;
  undefined1 local_78 [4];
  Uint32 t;
  string msg_1;
  undefined1 local_48 [8];
  string msg;
  Uint32 *SetSizes_local;
  IMemoryAllocator *pIStack_18;
  Uint32 NumSets_local;
  IMemoryAllocator *MemAllocator_local;
  ShaderResourceCacheVk *this_local;
  
  msg.field_2._8_8_ = SetSizes;
  SetSizes_local._4_4_ = NumSets;
  pIStack_18 = MemAllocator;
  MemAllocator_local = (IMemoryAllocator *)this;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->m_pMemory);
  if (bVar1) {
    FormatString<char[34]>((string *)local_48,(char (*) [34])"Memory has already been allocated");
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"InitializeSets",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
               ,0x37);
    std::__cxx11::string::~string((string *)local_48);
  }
  this->m_NumSets = (Uint16)SetSizes_local._4_4_;
  if (this->m_NumSets != SetSizes_local._4_4_) {
    FormatString<char[10],unsigned_int,char[37]>
              ((string *)local_78,(Diligent *)"NumSets (",(char (*) [10])((long)&SetSizes_local + 4)
               ,(uint *)") exceed maximum representable value",in_R8);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"InitializeSets",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
               ,0x44);
    std::__cxx11::string::~string((string *)local_78);
  }
  *(uint *)&this->field_0x1c = *(uint *)&this->field_0x1c & 0x80000000;
  for (msg_2.field_2._12_4_ = 0; (uint)msg_2.field_2._12_4_ < SetSizes_local._4_4_;
      msg_2.field_2._12_4_ = msg_2.field_2._12_4_ + 1) {
    if (*(int *)(msg.field_2._8_8_ + (long)(ulong)(uint)msg_2.field_2._12_4_ * 4) == 0) {
      FormatString<char[26],char[16]>
                ((string *)&MemorySize,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"SetSizes[t] > 0",(char (*) [16])(ulong)(uint)msg_2.field_2._12_4_);
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"InitializeSets",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
                 ,0x49);
      std::__cxx11::string::~string((string *)&MemorySize);
    }
    *(uint *)&this->field_0x1c =
         *(uint *)&this->field_0x1c & 0x80000000 |
         (*(uint *)&this->field_0x1c & 0x7fffffff) +
         *(int *)(msg.field_2._8_8_ + (ulong)(uint)msg_2.field_2._12_4_ * 4) & 0x7fffffff;
  }
  pacVar4 = (char (*) [55])
            ((ulong)SetSizes_local._4_4_ * 0x30 +
            (ulong)(*(uint *)&this->field_0x1c & 0x7fffffff) * 0x20);
  msg_3.field_2._8_8_ = pacVar4;
  Args_1 = (char (*) [55])GetRequiredMemorySize(SetSizes_local._4_4_,(Uint32 *)msg.field_2._8_8_);
  if (pacVar4 != Args_1) {
    FormatString<char[26],char[55]>
              ((string *)local_c8,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"MemorySize == GetRequiredMemorySize(NumSets, SetSizes)",Args_1);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"InitializeSets",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
               ,0x4e);
    std::__cxx11::string::~string((string *)local_c8);
  }
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::resize(&this->m_DbgInitializedResources,(ulong)this->m_NumSets);
  if (msg_3.field_2._8_8_ != 0) {
    iVar2 = (**pIStack_18->_vptr_IMemoryAllocator)
                      (pIStack_18,msg_3.field_2._8_8_,"Memory for shader resource cache data",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
                       ,0x55);
    STDDeleter<void,_Diligent::IMemoryAllocator>::STDDeleter
              ((STDDeleter<void,_Diligent::IMemoryAllocator> *)&pSets,pIStack_18);
    std::unique_ptr<void,Diligent::STDDeleter<void,Diligent::IMemoryAllocator>>::
    unique_ptr<Diligent::STDDeleter<void,Diligent::IMemoryAllocator>,void>
              ((unique_ptr<void,Diligent::STDDeleter<void,Diligent::IMemoryAllocator>> *)&local_d8,
               (pointer)CONCAT44(extraout_var,iVar2),
               (__enable_if_t<_is_lvalue_reference<STDDeleter<void,_IMemoryAllocator>_>::value,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_&&>
                )&pSets);
    std::unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>::operator=
              (&this->m_pMemory,&local_d8);
    std::unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>::~unique_ptr
              (&local_d8);
    pvVar5 = std::unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>::get
                       (&this->m_pMemory);
    pRStack_f0 = (Resource *)((long)pvVar5 + (long)(int)(uint)this->m_NumSets * 0x30);
    for (msg_4.field_2._12_4_ = 0; (uint)msg_4.field_2._12_4_ < SetSizes_local._4_4_;
        msg_4.field_2._12_4_ = msg_4.field_2._12_4_ + 1) {
      this_00 = GetDescriptorSet(this,msg_4.field_2._12_4_);
      if (*(int *)(msg.field_2._8_8_ + (ulong)(uint)msg_4.field_2._12_4_ * 4) == 0) {
        local_168 = (Resource *)0x0;
      }
      else {
        local_168 = pRStack_f0;
      }
      DescriptorSet::DescriptorSet
                (this_00,*(Uint32 *)(msg.field_2._8_8_ + (ulong)(uint)msg_4.field_2._12_4_ * 4),
                 local_168);
      pRStack_f0 = pRStack_f0 + *(uint *)(msg.field_2._8_8_ + (ulong)(uint)msg_4.field_2._12_4_ * 4)
      ;
      this_01 = std::
                vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                ::operator[](&this->m_DbgInitializedResources,(ulong)(uint)msg_4.field_2._12_4_);
      std::vector<bool,_std::allocator<bool>_>::resize
                (this_01,(ulong)*(uint *)(msg.field_2._8_8_ + (ulong)(uint)msg_4.field_2._12_4_ * 4)
                 ,false);
    }
    pvVar5 = std::unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>::get
                       (&this->m_pMemory);
    if (pRStack_f0 != (Resource *)((long)pvVar5 + msg_3.field_2._8_8_)) {
      FormatString<char[26],char[58]>
                ((string *)local_118,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"(char*)pCurrResPtr == (char*)m_pMemory.get() + MemorySize",
                 (char (*) [58])((long)pvVar5 + msg_3.field_2._8_8_));
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"InitializeSets",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
                 ,99);
      std::__cxx11::string::~string((string *)local_118);
    }
  }
  return;
}

Assistant:

void ShaderResourceCacheVk::InitializeSets(IMemoryAllocator& MemAllocator, Uint32 NumSets, const Uint32* SetSizes)
{
    VERIFY(!m_pMemory, "Memory has already been allocated");

    // Memory layout:
    //
    //  m_pMemory
    //  |
    //  V
    // ||  DescriptorSet[0]  |   ....    |  DescriptorSet[Ns-1]  |  Res[0]  |  ... |  Res[n-1]  |    ....     | Res[0]  |  ... |  Res[m-1]  ||
    //
    //
    //  Ns = m_NumSets

    m_NumSets = static_cast<Uint16>(NumSets);
    VERIFY(m_NumSets == NumSets, "NumSets (", NumSets, ") exceed maximum representable value");

    m_TotalResources = 0;
    for (Uint32 t = 0; t < NumSets; ++t)
    {
        VERIFY_EXPR(SetSizes[t] > 0);
        m_TotalResources += SetSizes[t];
    }

    const size_t MemorySize = NumSets * sizeof(DescriptorSet) + m_TotalResources * sizeof(Resource);
    VERIFY_EXPR(MemorySize == GetRequiredMemorySize(NumSets, SetSizes));
#ifdef DILIGENT_DEBUG
    m_DbgInitializedResources.resize(m_NumSets);
#endif
    if (MemorySize > 0)
    {
        m_pMemory = decltype(m_pMemory){
            ALLOCATE_RAW(MemAllocator, "Memory for shader resource cache data", MemorySize),
            STDDeleter<void, IMemoryAllocator>(MemAllocator) //
        };

        DescriptorSet* pSets       = reinterpret_cast<DescriptorSet*>(m_pMemory.get());
        Resource*      pCurrResPtr = reinterpret_cast<Resource*>(pSets + m_NumSets);
        for (Uint32 t = 0; t < NumSets; ++t)
        {
            new (&GetDescriptorSet(t)) DescriptorSet{SetSizes[t], SetSizes[t] > 0 ? pCurrResPtr : nullptr};
            pCurrResPtr += SetSizes[t];
#ifdef DILIGENT_DEBUG
            m_DbgInitializedResources[t].resize(SetSizes[t]);
#endif
        }
        VERIFY_EXPR((char*)pCurrResPtr == (char*)m_pMemory.get() + MemorySize);
    }
}